

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.cpp
# Opt level: O2

bool __thiscall
axl::cry::Rsa::generate(Rsa *this,uint_t keyLength,uint_t publicExponent,BN_GENCB *callback)

{
  bool bVar1;
  BigNum bigNum;
  Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_> local_30;
  
  BigNum::BigNum((BigNum *)&local_30);
  bVar1 = BigNum::create((BigNum *)&local_30);
  if (bVar1) {
    bVar1 = BigNum::setWord((BigNum *)&local_30,(ulong)publicExponent);
    if (bVar1) {
      bVar1 = generate(this,keyLength,local_30.m_h,callback);
      goto LAB_001259e3;
    }
  }
  bVar1 = false;
LAB_001259e3:
  sl::Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>::~Handle(&local_30);
  return bVar1;
}

Assistant:

bool
Rsa::generate(
	uint_t keyLength,
	uint_t publicExponent,
	BN_GENCB* callback
) {
	BigNum bigNum;

	return
		bigNum.create() &&
		bigNum.setWord(publicExponent) &&
		generate(keyLength, bigNum, callback);
}